

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-alloc.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  time_t tVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  ggml_gallocr_t allocr;
  ggml_cgraph *pgVar10;
  long lVar11;
  ulong uVar12;
  mapped_type *pmVar13;
  int32_t iVar14;
  ulong uVar15;
  pointer piVar16;
  ulong uVar17;
  int i;
  long lVar18;
  pointer piVar19;
  undefined1 auVar20 [16];
  id id;
  vector<int,_std::allocator<int>_> embd;
  vector<int,_std::allocator<int>_> embd_inp;
  long local_15e0;
  long local_15d8;
  ulong local_15d0;
  vector<float,_std::allocator<float>_> logits;
  gpt_params params;
  gpt_vocab vocab;
  undefined1 local_1468 [72];
  pointer local_1420;
  pointer pgStack_1418;
  pointer local_1410;
  ggml_context *local_13f8;
  _Rb_tree_node_base local_13e8;
  size_t local_13c8;
  mt19937 rng;
  
  ggml_time_init();
  lVar5 = ggml_time_us();
  gpt_params::gpt_params(&params);
  std::__cxx11::string::assign((char *)&params.model);
  bVar3 = gpt_params_parse(argc,argv,&params);
  if (bVar3) {
    if (params.seed < 0) {
      tVar6 = time((time_t *)0x0);
      params.seed = (int32_t)tVar6;
    }
    printf("%s: seed = %d\n","main");
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&rng,(long)params.seed);
    if (params.prompt._M_string_length == 0) {
      gpt_random_prompt_abi_cxx11_((string *)local_1468,&rng);
      std::__cxx11::string::operator=((string *)&params.prompt,(string *)local_1468);
      std::__cxx11::string::~string((string *)local_1468);
    }
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_13e8._M_left = &local_13e8;
    local_1468._0_8_ = (pointer)0x4000000c451;
    local_1468._8_8_ = 0xc00000300;
    local_1468._16_8_ = 0x10000000c;
    local_1468._24_4_ = 0x3727c5ac;
    local_1410 = (pointer)0x0;
    local_1420 = (pointer)0x0;
    pgStack_1418 = (pointer)0x0;
    local_13e8._M_color = _S_red;
    local_13e8._M_parent = (_Base_ptr)0x0;
    local_13c8 = 0;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_13e8._M_right = local_13e8._M_left;
    lVar7 = ggml_time_us();
    bVar3 = gpt2_model_load(&params.model,(gpt2_model *)local_1468,&vocab);
    if (bVar3) {
      lVar8 = ggml_time_us();
      test_gpt_tokenizer(&vocab,&params.token_test);
      uVar9 = ggml_backend_cpu_buffer_type();
      allocr = (ggml_gallocr_t)ggml_gallocr_new(uVar9);
      iVar14 = params.n_batch;
      if ((int)local_1468._4_4_ <= params.n_batch) {
        iVar14 = local_1468._4_4_;
      }
      pgVar10 = gpt2_graph((gpt2_model *)local_1468,local_1468._4_4_ - iVar14,iVar14);
      ggml_gallocr_reserve(allocr,pgVar10);
      uVar9 = ggml_gallocr_get_buffer_size(allocr,0);
      auVar20._8_4_ = (int)((ulong)uVar9 >> 0x20);
      auVar20._0_8_ = uVar9;
      auVar20._12_4_ = 0x45300000;
      fprintf(_stderr,"%s: compute buffer size: %.2f MB\n",
              SUB84(((auVar20._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * 0.0009765625 *
                    0.0009765625,0),"main");
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      gpt_tokenize(&embd_inp,&vocab,&params.prompt);
      iVar4 = local_1468._4_4_ -
              (int)((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      if (params.n_predict <= iVar4) {
        iVar4 = params.n_predict;
      }
      params.n_predict = iVar4;
      printf("%s: prompt: \'%s\'\n","main",params.prompt._M_dataplus._M_p);
      printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",
             (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
      lVar18 = 0;
      while( true ) {
        iVar4 = (int)((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
        if (7 < iVar4) {
          iVar4 = 8;
        }
        if (iVar4 <= lVar18) break;
        printf("%d ",(ulong)(uint)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar18]);
        lVar18 = lVar18 + 1;
      }
      puts("\n");
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_15d8 = 0;
      local_15d0 = 0;
      local_15e0 = 0;
      iVar4 = 0;
      do {
        if ((ulong)((long)params.n_predict +
                   ((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2)) <= local_15d0) break;
        if (embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          lVar18 = ggml_time_us();
          gpt2_eval((gpt2_model *)local_1468,allocr,params.n_threads,iVar4,&embd,&logits);
          lVar11 = ggml_time_us();
          local_15d8 = (local_15d8 - lVar18) + lVar11;
        }
        fVar2 = params.temp;
        fVar1 = params.top_p;
        iVar14 = params.top_k;
        uVar15 = (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar15 != 0) {
          embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        if (local_15d0 <
            (ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2)) {
          lVar18 = local_15d0 * 4;
          uVar17 = local_15d0 - 1;
          piVar19 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar17 = uVar17 + 1;
            if ((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) <= uVar17) {
              uVar12 = (long)piVar19 -
                       (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              break;
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      (&embd,(value_type_conflict3 *)
                             ((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar18));
            lVar18 = lVar18 + 4;
            uVar12 = (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
            piVar19 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          } while ((int)(uVar12 >> 2) < params.n_batch);
          local_15d0 = (local_15d0 + ((long)uVar12 >> 2)) - 1;
        }
        else {
          lVar11 = (long)(int)local_1468._0_4_;
          id = 0;
          lVar18 = ggml_time_us();
          id = gpt_sample_top_k_top_p
                         (&vocab,logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                                 (((ulong)((long)logits.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)logits.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 2) -
                                 lVar11),iVar14,(double)fVar1,(double)fVar2,&rng);
          lVar11 = ggml_time_us();
          std::vector<int,_std::allocator<int>_>::push_back(&embd,&id);
          local_15e0 = (local_15e0 - lVar18) + lVar11;
          piVar19 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        iVar4 = iVar4 + (int)(uVar15 >> 2);
        for (piVar16 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar16 != piVar19; piVar16 = piVar16 + 1)
        {
          id = *piVar16;
          pmVar13 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&vocab.id_to_token,&id);
          printf("%s",(pmVar13->_M_dataplus)._M_p);
        }
        fflush(_stdout);
        local_15d0 = local_15d0 + 1;
      } while (embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish[-1] != 0xc450);
      lVar18 = ggml_time_us();
      puts("\n");
      printf("%s:     load time = %8.2f ms\n",SUB84((double)((float)(lVar8 - lVar7) / 1000.0),0),
             "main");
      printf("%s:   sample time = %8.2f ms\n",SUB84((double)((float)local_15e0 / 1000.0),0),"main");
      printf("%s:  predict time = %8.2f ms / %.2f ms per token\n",
             SUB84((double)((float)local_15d8 / 1000.0),0),
             (double)(((float)local_15d8 / 1000.0) / (float)iVar4),"main");
      printf("%s:    total time = %8.2f ms\n",SUB84((double)((float)(lVar18 - lVar5) / 1000.0),0),
             "main");
      ggml_free(local_13f8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&embd.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&embd_inp.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&logits.super__Vector_base<float,_std::allocator<float>_>);
      iVar4 = 0;
    }
    else {
      fprintf(_stderr,"%s: failed to load model from \'%s\'\n","main",params.model._M_dataplus._M_p)
      ;
      iVar4 = 1;
    }
    gpt2_model::~gpt2_model((gpt2_model *)local_1468);
    gpt_vocab::~gpt_vocab(&vocab);
  }
  else {
    iVar4 = 1;
  }
  gpt_params::~gpt_params(&params);
  return iVar4;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;
    params.model = "models/gpt-2-117M/ggml-model.bin";

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    ggml_gallocr_t allocr = NULL;
    // allocate the compute buffer
    {
        allocr = ggml_gallocr_new(ggml_backend_cpu_buffer_type());

        // create the worst case graph for memory usage estimation
        int n_tokens = std::min(model.hparams.n_ctx, params.n_batch);
        int n_past = model.hparams.n_ctx - n_tokens;
        struct ggml_cgraph * gf = gpt2_graph(model, n_past, n_tokens);

        // pre-allocate the compute buffer for the worst case (optional)
        ggml_gallocr_reserve(allocr, gf);
        size_t mem_size =  ggml_gallocr_get_buffer_size(allocr, 0);
        fprintf(stderr, "%s: compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    // submit the input prompt token-by-token
    // this reduces the memory usage during inference, at the cost of a bit of speed at the beginning
    std::vector<gpt_vocab::id> embd;

    for (size_t i = embd.size(); i < embd_inp.size() + params.n_predict; i++) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!gpt2_eval(model, allocr, params.n_threads, n_past, embd, logits)) {
                printf("Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (i >= embd_inp.size()) {
            // sample next token
            const int   top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits.data() + (logits.size() - n_vocab), top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);
        } else {
            // if here, it means we are still processing the input prompt
            for (size_t k = i; k < embd_inp.size(); k++) {
                embd.push_back(embd_inp[k]);
                if (int32_t(embd.size()) >= params.n_batch) {
                    break;
                }
            }
            i += embd.size() - 1;
        }

        // display text
        for (auto id : embd) {
            printf("%s", vocab.id_to_token[id].c_str());
        }
        fflush(stdout);

        // end of text token
        if (embd.back() == 50256) {
            break;
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx_w);

    return 0;
}